

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Representation RVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Statistics *pSVar8;
  undefined8 uVar9;
  bool bVar10;
  int iVar11;
  Type TVar12;
  Settings *pSVar13;
  int iVar14;
  Verbosity old_verbosity;
  Representation RVar15;
  Type tp;
  bool bVar16;
  double extraout_XMM0_Qa;
  Real RVar17;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar18;
  double dVar19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined5 uStack_150;
  undefined3 uStack_14b;
  undefined5 local_148;
  undefined3 uStack_143;
  int local_140;
  bool local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined5 uStack_110;
  undefined3 uStack_10b;
  undefined5 local_108;
  undefined3 uStack_103;
  int local_100;
  bool local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 local_c8;
  undefined3 uStack_c3;
  int local_c0;
  bool local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 local_88;
  undefined3 uStack_83;
  int local_80;
  bool local_7c;
  undefined8 local_78;
  undefined8 local_68;
  uint auStack_60 [5];
  undefined3 uStack_4b;
  uint local_48;
  undefined3 uStack_43;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  pSVar13 = this->_currentSettings;
  dVar18 = pSVar13->_realParamValues[6];
  iVar11 = -1;
  if ((double)pSVar13->_intParamValues[5] < dVar18) {
    iVar14 = pSVar13->_intParamValues[5] - this->_statistics->iterations;
    iVar11 = -1;
    if (-1 < iVar14) {
      iVar11 = iVar14;
    }
  }
  bVar16 = this->_hasBasis;
  (this->_solver).maxIters = iVar11;
  dVar19 = pSVar13->_realParamValues[7];
  if (dVar19 < dVar18) {
    (*this->_statistics->solvingTime->_vptr_Timer[6])();
    dVar18 = dVar19 - extraout_XMM0_Qa;
  }
  RVar17 = 0.0;
  if (0.0 <= dVar18) {
    RVar17 = dVar18;
  }
  (this->_solver).maxTime = RVar17;
  RVar17 = Tolerances::epsilon((this->_solver).
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  local_38._0_4_ = cpp_dec_float_finite;
  local_38._4_4_ = 10;
  local_68._0_4_ = 0;
  local_68._4_4_ = 0;
  auStack_60[0] = 0;
  auStack_60[1] = 0;
  auStack_60[2] = 0;
  auStack_60[3] = 0;
  stack0xffffffffffffffb0 = 0;
  uStack_4b = 0;
  _local_48 = 0;
  uStack_43 = 0;
  local_40 = 0;
  local_3c = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,RVar17);
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems._32_5_ = 0;
  local_1a8.data._M_elems[9]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1a8,10000.0);
  local_1e8.data._M_elems[0] = (uint)local_68;
  local_1e8.data._M_elems[1] = local_68._4_4_;
  local_1e8.data._M_elems[2] = auStack_60[0];
  local_1e8.data._M_elems[3] = auStack_60[1];
  local_1e8.data._M_elems[4] = auStack_60[2];
  local_1e8.data._M_elems[5] = auStack_60[3];
  local_1e8.data._M_elems._24_5_ = stack0xffffffffffffffb0;
  local_1e8.data._M_elems[7]._1_3_ = uStack_4b;
  local_1e8.data._M_elems._32_5_ = _local_48;
  local_1e8.data._M_elems[9]._1_3_ = uStack_43;
  local_1e8.exp = local_40;
  local_1e8.neg = (bool)local_3c;
  local_1e8.fpclass = (fpclass_type)local_38;
  local_1e8.prec_elem = local_38._4_4_;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1e8,&local_1a8);
  pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  RVar17 = Tolerances::floatingPointFeastol(pTVar6);
  bVar10 = false;
  if ((!NAN(RVar17)) && (local_1e8.fpclass != cpp_dec_float_NaN)) {
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8.data._M_elems[9]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar17);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1e8,&local_1a8);
    bVar10 = 0 < iVar11;
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (bVar10) {
    pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&local_1e8);
    Tolerances::setFloatingPointFeastol(pTVar6,dVar18);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
  }
  pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  RVar17 = Tolerances::floatingPointOpttol(pTVar6);
  bVar10 = false;
  if ((!NAN(RVar17)) && (bVar10 = false, local_1e8.fpclass != cpp_dec_float_NaN)) {
    local_1a8.fpclass = cpp_dec_float_finite;
    local_1a8.prec_elem = 10;
    local_1a8.data._M_elems[0] = 0;
    local_1a8.data._M_elems[1] = 0;
    local_1a8.data._M_elems[2] = 0;
    local_1a8.data._M_elems[3] = 0;
    local_1a8.data._M_elems[4] = 0;
    local_1a8.data._M_elems[5] = 0;
    local_1a8.data._M_elems._24_5_ = 0;
    local_1a8.data._M_elems[7]._1_3_ = 0;
    local_1a8.data._M_elems._32_5_ = 0;
    local_1a8.data._M_elems[9]._1_3_ = 0;
    local_1a8.exp = 0;
    local_1a8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1a8,RVar17);
    iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1e8,&local_1a8);
    bVar10 = 0 < iVar11;
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (bVar10) {
    pTVar6 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var7 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    dVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::extract_double
                       (&local_1e8);
    Tolerances::setFloatingPointOpttol(pTVar6,dVar18);
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
  }
  this_00 = &this->_solver;
  iVar11 = this->_currentSettings->_intParamValues[1];
  if (iVar11 == 2) {
    RVar15 = ROW;
    if ((this->_solver).theRep != ROW) {
LAB_0034b406:
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::initRep(this_00,RVar15);
    }
  }
  else if (iVar11 == 1) {
    RVar15 = COLUMN;
    if ((this->_solver).theRep != COLUMN) goto LAB_0034b406;
  }
  else if (iVar11 == 0) {
    dVar18 = (double)((this->_solver).
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum + 1) * this->_currentSettings->_realParamValues[0x10];
    dVar19 = (double)((this->_solver).
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum + 1);
    RVar5 = (this->_solver).theRep;
    RVar15 = COLUMN;
    if ((RVar5 != COLUMN && dVar19 <= dVar18) || (RVar15 = ROW, RVar5 != ROW && dVar18 < dVar19))
    goto LAB_0034b406;
  }
  iVar11 = this->_currentSettings->_intParamValues[2];
  if (iVar11 == 1) {
    TVar12 = (this->_solver).theType;
    RVar15 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar12 == ENTER || RVar15 != ROW) {
      if (RVar15 != COLUMN) goto LAB_0034b486;
LAB_0034b474:
      tp = LEAVE;
      if (TVar12 == LEAVE) goto LAB_0034b486;
    }
  }
  else {
    if (iVar11 != 0) goto LAB_0034b486;
    TVar12 = (this->_solver).theType;
    RVar15 = (this->_solver).theRep;
    tp = ENTER;
    if (TVar12 == ENTER || RVar15 != COLUMN) {
      if (RVar15 != ROW) goto LAB_0034b486;
      goto LAB_0034b474;
    }
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setType(this_00,tp);
LAB_0034b486:
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,this->_currentSettings->_realParamValues[0xf])
  ;
  *(undefined8 *)(this->_solver).sparsePricingFactor.m_backend.data._M_elems = local_a8;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 2) = uStack_a0;
  *(undefined8 *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 4) = local_98;
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_8b,uStack_90);
  *(ulong *)((this->_solver).sparsePricingFactor.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_83,local_88);
  (this->_solver).sparsePricingFactor.m_backend.exp = local_80;
  (this->_solver).sparsePricingFactor.m_backend.neg = local_7c;
  (this->_solver).sparsePricingFactor.m_backend.fpclass = (undefined4)local_78;
  (this->_solver).sparsePricingFactor.m_backend.prec_elem = local_78._4_4_;
  pSVar13 = this->_currentSettings;
  iVar11 = pSVar13->_intParamValues[0x14];
  if (iVar11 == 0) {
    (this->_solver).hyperPricingLeave = false;
    (this->_solver).hyperPricingEnter = false;
  }
  else if ((iVar11 == 2) ||
          ((iVar11 == 1 &&
           (5000 < (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum +
                   (this->_solver).
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum)))) {
    (this->_solver).hyperPricingLeave = true;
    (this->_solver).hyperPricingEnter = true;
    DIdxSet::setMax(&(this->_solver).updateViols,(((this->_solver).thecovectors)->set).thenum);
    DIdxSet::setMax(&(this->_solver).updateViolsCo,(((this->_solver).thevectors)->set).thenum);
    pSVar13 = this->_currentSettings;
  }
  local_b8 = 0xa00000000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  uStack_cb = 0;
  local_c8 = 0;
  uStack_c3 = 0;
  local_c0 = 0;
  local_bc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_e8,pSVar13->_realParamValues[0x13]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .nonzeroFactor.m_backend.data._M_elems = local_e8;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 2) = uStack_e0;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .nonzeroFactor.m_backend.data._M_elems + 4) = local_d8;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_cb,uStack_d0);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .nonzeroFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_c3,local_c8);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.exp = local_c0;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.neg = local_bc;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.fpclass = (undefined4)local_b8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .nonzeroFactor.m_backend.prec_elem = local_b8._4_4_;
  local_f8 = 0xa00000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_10b = 0;
  local_108 = 0;
  uStack_103 = 0;
  local_100 = 0;
  local_fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,
             this->_currentSettings->_realParamValues[0x14]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .fillFactor.m_backend.data._M_elems = local_128;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 2) = uStack_120;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .fillFactor.m_backend.data._M_elems + 4) = local_118;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_10b,uStack_110);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .fillFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_103,local_108);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.exp = local_100;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.neg = local_fc;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.fpclass = (undefined4)local_f8;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .fillFactor.m_backend.prec_elem = local_f8._4_4_;
  local_138 = 0xa00000000;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_14b = 0;
  local_148 = 0;
  uStack_143 = 0;
  local_140 = 0;
  local_13c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,
             this->_currentSettings->_realParamValues[0x15]);
  *(undefined8 *)
   (this->_solver).
   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   .memFactor.m_backend.data._M_elems = local_168;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 2) = uStack_160;
  *(undefined8 *)
   ((this->_solver).
    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memFactor.m_backend.data._M_elems + 4) = local_158;
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memFactor.m_backend.data._M_elems + 6) = CONCAT35(uStack_14b,uStack_150);
  *(ulong *)((this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memFactor.m_backend.data._M_elems + 8) = CONCAT35(uStack_143,local_148);
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.exp = local_140;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.neg = local_13c;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.fpclass = (undefined4)local_138;
  (this->_solver).
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memFactor.m_backend.prec_elem = local_138._4_4_;
  (*this->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(this_00,interrupt,true);
  (*this->_statistics->simplexTime->_vptr_Timer[4])();
  iVar11 = (this->_solver).
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .iterCount;
  if ((0 < iVar11) && ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,(EVP_PKEY_CTX *)interrupt);
    iVar11 = (this->_solver).
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .iterCount;
  }
  pSVar8 = this->_statistics;
  pSVar8->iterations = pSVar8->iterations + iVar11;
  iVar14 = iVar11;
  if (iVar11 != 0) {
    iVar14 = (this->_solver).primalCount;
  }
  pSVar8->iterationsPrimal = pSVar8->iterationsPrimal + iVar14;
  iVar14 = 0;
  if (bVar16 != false) {
    iVar14 = iVar11;
  }
  pSVar8->iterationsFromBasis = pSVar8->iterationsFromBasis + iVar14;
  pSVar8->iterationsPolish = pSVar8->iterationsPolish + (this->_solver).polishCount;
  pSVar8->boundflips = pSVar8->boundflips + (this->_solver).totalboundflips;
  (*((this->_solver).multTimeSparse)->_vptr_Timer[6])();
  this->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + this->_statistics->multTimeSparse;
  (*((this->_solver).multTimeFull)->_vptr_Timer[6])();
  this->_statistics->multTimeFull = extraout_XMM0_Qa_01 + this->_statistics->multTimeFull;
  (*((this->_solver).multTimeColwise)->_vptr_Timer[6])();
  this->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + this->_statistics->multTimeColwise;
  (*((this->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  pSVar8 = this->_statistics;
  pSVar8->multTimeUnsetup = extraout_XMM0_Qa_03 + pSVar8->multTimeUnsetup;
  uVar1 = (this->_solver).multSparseCalls;
  uVar2 = (this->_solver).multFullCalls;
  uVar3 = (this->_solver).multColwiseCalls;
  uVar4 = (this->_solver).multUnsetupCalls;
  pSVar8->multSparseCalls = pSVar8->multSparseCalls + uVar1;
  pSVar8->multFullCalls = pSVar8->multFullCalls + uVar2;
  pSVar8->multColwiseCalls = pSVar8->multColwiseCalls + uVar3;
  pSVar8->multUnsetupCalls = pSVar8->multUnsetupCalls + uVar4;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[6])();
  this->_statistics->luFactorizationTimeReal =
       extraout_XMM0_Qa_04 + this->_statistics->luFactorizationTimeReal;
  (*((this->_slufactor).solveTime)->_vptr_Timer[6])();
  pSVar8 = this->_statistics;
  pSVar8->luSolveTimeReal = extraout_XMM0_Qa_05 + pSVar8->luSolveTimeReal;
  pSVar8->luFactorizationsReal =
       pSVar8->luFactorizationsReal +
       (this->_slufactor).
       super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .factorCount;
  pSVar8->luSolvesReal = pSVar8->luSolvesReal + (this->_slufactor).solveCount;
  (*((this->_slufactor).
     super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .factorTime)->_vptr_Timer[2])();
  (*((this->_slufactor).solveTime)->_vptr_Timer[2])();
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .factorCount = 0;
  (this->_slufactor).
  super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .hugeValues = 0;
  (this->_slufactor).solveCount = 0;
  bVar16 = (this->_solver).theRep == ROW;
  pSVar8 = this->_statistics;
  pSVar8->degenPivotsPrimal =
       pSVar8->degenPivotsPrimal +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)bVar16 - 4];
  pSVar8->degenPivotsDual =
       pSVar8->degenPivotsDual +
       (this->_solver).primalDegenSum.m_backend.data._M_elems[(ulong)!bVar16 - 4];
  uVar9 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 8);
  local_1a8.data._M_elems._32_5_ = SUB85(uVar9,0);
  local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_1a8.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).dualDegenSum.m_backend.data._M_elems;
  local_1a8.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 2);
  local_1a8.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 4);
  uVar9 = *(undefined8 *)((this->_solver).dualDegenSum.m_backend.data._M_elems + 6);
  local_1a8.data._M_elems._24_5_ = SUB85(uVar9,0);
  local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_1a8.exp = (this->_solver).dualDegenSum.m_backend.exp;
  local_1a8.neg = (this->_solver).dualDegenSum.m_backend.neg;
  local_1a8.fpclass = (this->_solver).dualDegenSum.m_backend.fpclass;
  local_1a8.prec_elem = (this->_solver).dualDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(pSVar8->sumDualDegen).m_backend,&local_1a8);
  uVar9 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 8);
  local_1a8.data._M_elems._32_5_ = SUB85(uVar9,0);
  local_1a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_1a8.data._M_elems._0_8_ =
       *(undefined8 *)(this->_solver).primalDegenSum.m_backend.data._M_elems;
  local_1a8.data._M_elems._8_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 2);
  local_1a8.data._M_elems._16_8_ =
       *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 4);
  uVar9 = *(undefined8 *)((this->_solver).primalDegenSum.m_backend.data._M_elems + 6);
  local_1a8.data._M_elems._24_5_ = SUB85(uVar9,0);
  local_1a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_1a8.exp = (this->_solver).primalDegenSum.m_backend.exp;
  local_1a8.neg = (this->_solver).primalDegenSum.m_backend.neg;
  local_1a8.fpclass = (this->_solver).primalDegenSum.m_backend.fpclass;
  local_1a8.prec_elem = (this->_solver).primalDegenSum.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(this->_statistics->sumPrimalDegen).m_backend,&local_1a8);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}